

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaCorot_20::ComputeMatrB
          (ChElementHexaCorot_20 *this,ChMatrixDynamic<> *MatrB,double zeta1,double zeta2,
          double zeta3,double *JacobianDet)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  long lVar4;
  ActualDstType actualDst;
  Scalar SVar5;
  ChMatrixDynamic<> Btemp;
  ChMatrixDynamic<> Jacobian;
  ChMatrixDynamic<> J1;
  ChMatrixDynamic<> Jinv;
  double *local_d8;
  ulong local_d0;
  ulong local_c8;
  assign_op<double,_double> local_b9;
  DenseStorage<double,__1,__1,__1,_1> local_b8;
  DenseStorage<double,__1,__1,__1,_1> local_98;
  double local_80;
  double local_78;
  double local_70;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_68;
  long local_50 [2];
  long local_40;
  double local_38;
  double local_30;
  double local_28;
  
  local_b8.m_data = (double *)0x0;
  local_b8.m_rows = 0;
  local_b8.m_cols = 0;
  local_80 = zeta1;
  local_78 = zeta2;
  local_70 = zeta3;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_b8,9,3,3);
  local_98.m_data = (double *)0x0;
  local_98.m_rows = 0;
  local_98.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_98,0x3c,3,0x14);
  local_38 = local_80;
  local_30 = local_78;
  local_28 = local_70;
  (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[0xc])(this,&local_b8,&local_98);
  SVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::determinant
                    ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_b8);
  *JacobianDet = SVar5;
  if (local_b8.m_rows != local_b8.m_cols) {
    __assert_fail("rows() == cols()","/usr/include/eigen3/Eigen/src/LU/InverseImpl.h",0x15f,
                  "const Inverse<Derived> Eigen::MatrixBase<Eigen::Matrix<double, -1, -1, 1>>::inverse() const [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  local_68.m_rows.m_value = (long)&local_b8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
  PlainObjectBase<Eigen::Inverse<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_50,
             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_> *)&local_68);
  if (local_40 == local_98.m_rows) {
    local_68.m_rows.m_value = (long)local_50;
    local_68.m_cols.m_value = (long)&local_98;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_d8,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
                *)&local_68);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)MatrB,0x168,6,0x3c);
    local_68.m_rows.m_value =
         (MatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
    local_68.m_cols.m_value =
         (MatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
    local_68.m_functor.m_other = 0.0;
    if ((local_68.m_cols.m_value | local_68.m_rows.m_value) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              (MatrB,&local_68,&local_b9);
    if ((((0 < (long)local_d0) && (0 < (long)local_c8)) &&
        (uVar1 = (MatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage
                 .m_rows, 0 < (long)uVar1)) &&
       (uVar2 = (MatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                m_cols, 0 < (long)uVar2)) {
      pdVar3 = (MatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
               m_data;
      *pdVar3 = *local_d8;
      if (((((((((local_c8 != 1) && (3 < uVar2)) &&
               ((pdVar3[3] = local_d8[1], 2 < local_c8 &&
                ((6 < uVar2 && (pdVar3[6] = local_d8[2], local_c8 != 3)))))) && (9 < uVar2)) &&
             (((pdVar3[9] = local_d8[3], 4 < local_c8 && (0xc < uVar2)) &&
              (pdVar3[0xc] = local_d8[4], local_c8 != 5)))) &&
            (((0xf < uVar2 && (pdVar3[0xf] = local_d8[5], 6 < local_c8)) &&
             ((0x12 < uVar2 && ((pdVar3[0x12] = local_d8[6], local_c8 != 7 && (0x15 < uVar2))))))))
           && ((pdVar3[0x15] = local_d8[7], 8 < local_c8 &&
               (((((0x18 < uVar2 && (pdVar3[0x18] = local_d8[8], local_c8 != 9)) && (0x1b < uVar2))
                 && (((pdVar3[0x1b] = local_d8[9], 10 < local_c8 && (0x1e < uVar2)) &&
                     ((pdVar3[0x1e] = local_d8[10], local_c8 != 0xb &&
                      ((0x21 < uVar2 && (pdVar3[0x21] = local_d8[0xb], 0xc < local_c8)))))))) &&
                (0x24 < uVar2)))))) &&
          (((((((pdVar3[0x24] = local_d8[0xc], local_c8 != 0xd && (0x27 < uVar2)) &&
               (pdVar3[0x27] = local_d8[0xd], 0xe < local_c8)) &&
              ((0x2a < uVar2 && (pdVar3[0x2a] = local_d8[0xe], local_c8 != 0xf)))) && (0x2d < uVar2)
             ) && ((pdVar3[0x2d] = local_d8[0xf], 0x10 < local_c8 && (0x30 < uVar2)))) &&
           (((pdVar3[0x30] = local_d8[0x10], local_c8 != 0x11 &&
             (((0x33 < uVar2 && (pdVar3[0x33] = local_d8[0x11], 0x12 < local_c8)) && (0x36 < uVar2))
             )) && (((pdVar3[0x36] = local_d8[0x12], local_c8 != 0x13 && (0x39 < uVar2)) &&
                    (pdVar3[0x39] = local_d8[0x13], local_d0 != 1)))))))) && (uVar1 != 1)) {
        pdVar3[uVar2 + 1] = local_d8[local_c8];
        pdVar3[uVar2 + 4] = local_d8[local_c8 + 1];
        pdVar3[uVar2 + 7] = local_d8[local_c8 + 2];
        pdVar3[uVar2 + 10] = local_d8[local_c8 + 3];
        pdVar3[uVar2 + 0xd] = local_d8[local_c8 + 4];
        pdVar3[uVar2 + 0x10] = local_d8[local_c8 + 5];
        pdVar3[uVar2 + 0x13] = local_d8[local_c8 + 6];
        pdVar3[uVar2 + 0x16] = local_d8[local_c8 + 7];
        pdVar3[uVar2 + 0x19] = local_d8[local_c8 + 8];
        pdVar3[uVar2 + 0x1c] = local_d8[local_c8 + 9];
        pdVar3[uVar2 + 0x1f] = local_d8[local_c8 + 10];
        pdVar3[uVar2 + 0x22] = local_d8[local_c8 + 0xb];
        pdVar3[uVar2 + 0x25] = local_d8[local_c8 + 0xc];
        pdVar3[uVar2 + 0x28] = local_d8[local_c8 + 0xd];
        pdVar3[uVar2 + 0x2b] = local_d8[local_c8 + 0xe];
        pdVar3[uVar2 + 0x2e] = local_d8[local_c8 + 0xf];
        pdVar3[uVar2 + 0x31] = local_d8[local_c8 + 0x10];
        pdVar3[uVar2 + 0x34] = local_d8[local_c8 + 0x11];
        pdVar3[uVar2 + 0x37] = local_d8[local_c8 + 0x12];
        if (((uVar2 != 0x3a) && (pdVar3[uVar2 + 0x3a] = local_d8[local_c8 + 0x13], 2 < local_d0)) &&
           (2 < uVar1)) {
          pdVar3[uVar2 * 2 + 2] = local_d8[local_c8 * 2];
          pdVar3[uVar2 * 2 + 5] = local_d8[local_c8 * 2 + 1];
          pdVar3[uVar2 * 2 + 8] = local_d8[local_c8 * 2 + 2];
          pdVar3[uVar2 * 2 + 0xb] = local_d8[local_c8 * 2 + 3];
          pdVar3[uVar2 * 2 + 0xe] = local_d8[local_c8 * 2 + 4];
          pdVar3[uVar2 * 2 + 0x11] = local_d8[local_c8 * 2 + 5];
          pdVar3[uVar2 * 2 + 0x14] = local_d8[local_c8 * 2 + 6];
          pdVar3[uVar2 * 2 + 0x17] = local_d8[local_c8 * 2 + 7];
          pdVar3[uVar2 * 2 + 0x1a] = local_d8[local_c8 * 2 + 8];
          pdVar3[uVar2 * 2 + 0x1d] = local_d8[local_c8 * 2 + 9];
          pdVar3[uVar2 * 2 + 0x20] = local_d8[local_c8 * 2 + 10];
          pdVar3[uVar2 * 2 + 0x23] = local_d8[local_c8 * 2 + 0xb];
          pdVar3[uVar2 * 2 + 0x26] = local_d8[local_c8 * 2 + 0xc];
          pdVar3[uVar2 * 2 + 0x29] = local_d8[local_c8 * 2 + 0xd];
          pdVar3[uVar2 * 2 + 0x2c] = local_d8[local_c8 * 2 + 0xe];
          pdVar3[uVar2 * 2 + 0x2f] = local_d8[local_c8 * 2 + 0xf];
          pdVar3[uVar2 * 2 + 0x32] = local_d8[local_c8 * 2 + 0x10];
          pdVar3[uVar2 * 2 + 0x35] = local_d8[local_c8 * 2 + 0x11];
          pdVar3[uVar2 * 2 + 0x38] = local_d8[local_c8 * 2 + 0x12];
          if ((0x3b < uVar2) &&
             (pdVar3[uVar2 * 2 + 0x3b] = local_d8[local_c8 * 2 + 0x13], uVar1 != 3)) {
            pdVar3[uVar2 * 3] = local_d8[local_c8];
            pdVar3[uVar2 * 3 + 1] = *local_d8;
            pdVar3[uVar2 * 3 + 3] = local_d8[local_c8 + 1];
            pdVar3[uVar2 * 3 + 4] = local_d8[1];
            pdVar3[uVar2 * 3 + 6] = local_d8[local_c8 + 2];
            pdVar3[uVar2 * 3 + 7] = local_d8[2];
            pdVar3[uVar2 * 3 + 9] = local_d8[local_c8 + 3];
            pdVar3[uVar2 * 3 + 10] = local_d8[3];
            pdVar3[uVar2 * 3 + 0xc] = local_d8[local_c8 + 4];
            pdVar3[uVar2 * 3 + 0xd] = local_d8[4];
            pdVar3[uVar2 * 3 + 0xf] = local_d8[local_c8 + 5];
            pdVar3[uVar2 * 3 + 0x10] = local_d8[5];
            pdVar3[uVar2 * 3 + 0x12] = local_d8[local_c8 + 6];
            pdVar3[uVar2 * 3 + 0x13] = local_d8[6];
            pdVar3[uVar2 * 3 + 0x15] = local_d8[local_c8 + 7];
            pdVar3[uVar2 * 3 + 0x16] = local_d8[7];
            pdVar3[uVar2 * 3 + 0x18] = local_d8[local_c8 + 8];
            pdVar3[uVar2 * 3 + 0x19] = local_d8[8];
            pdVar3[uVar2 * 3 + 0x1b] = local_d8[local_c8 + 9];
            pdVar3[uVar2 * 3 + 0x1c] = local_d8[9];
            pdVar3[uVar2 * 3 + 0x1e] = local_d8[local_c8 + 10];
            if ((10 < (long)local_c8) && (pdVar3[uVar2 * 3 + 0x1f] = local_d8[10], local_c8 != 0xb))
            {
              pdVar3[uVar2 * 3 + 0x21] = local_d8[local_c8 + 0xb];
              if ((0xb < (long)local_c8) &&
                 (pdVar3[uVar2 * 3 + 0x22] = local_d8[0xb], local_c8 != 0xc)) {
                pdVar3[uVar2 * 3 + 0x24] = local_d8[local_c8 + 0xc];
                if ((0xc < (long)local_c8) &&
                   (pdVar3[uVar2 * 3 + 0x25] = local_d8[0xc], local_c8 != 0xd)) {
                  pdVar3[uVar2 * 3 + 0x27] = local_d8[local_c8 + 0xd];
                  if ((0xd < (long)local_c8) &&
                     (pdVar3[uVar2 * 3 + 0x28] = local_d8[0xd], local_c8 != 0xe)) {
                    pdVar3[uVar2 * 3 + 0x2a] = local_d8[local_c8 + 0xe];
                    if ((0xe < (long)local_c8) &&
                       (pdVar3[uVar2 * 3 + 0x2b] = local_d8[0xe], local_c8 != 0xf)) {
                      pdVar3[uVar2 * 3 + 0x2d] = local_d8[local_c8 + 0xf];
                      if ((0xf < (long)local_c8) &&
                         (pdVar3[uVar2 * 3 + 0x2e] = local_d8[0xf], local_c8 != 0x10)) {
                        pdVar3[uVar2 * 3 + 0x30] = local_d8[local_c8 + 0x10];
                        if ((0x10 < (long)local_c8) &&
                           (pdVar3[uVar2 * 3 + 0x31] = local_d8[0x10], local_c8 != 0x11)) {
                          pdVar3[uVar2 * 3 + 0x33] = local_d8[local_c8 + 0x11];
                          if ((0x11 < (long)local_c8) &&
                             (pdVar3[uVar2 * 3 + 0x34] = local_d8[0x11], local_c8 != 0x12)) {
                            pdVar3[uVar2 * 3 + 0x36] = local_d8[local_c8 + 0x12];
                            if ((0x12 < (long)local_c8) &&
                               (pdVar3[uVar2 * 3 + 0x37] = local_d8[0x12], local_c8 != 0x13)) {
                              pdVar3[uVar2 * 3 + 0x39] = local_d8[local_c8 + 0x13];
                              if ((0x13 < (long)local_c8) &&
                                 (pdVar3[uVar2 * 3 + 0x3a] = local_d8[0x13], uVar1 != 4)) {
                                pdVar3[uVar2 * 4 + 1] = local_d8[local_c8 * 2];
                                pdVar3[uVar2 * 4 + 2] = local_d8[local_c8];
                                pdVar3[uVar2 * 4 + 4] = local_d8[local_c8 * 2 + 1];
                                pdVar3[uVar2 * 4 + 5] = local_d8[local_c8 + 1];
                                pdVar3[uVar2 * 4 + 7] = local_d8[local_c8 * 2 + 2];
                                pdVar3[uVar2 * 4 + 8] = local_d8[local_c8 + 2];
                                pdVar3[uVar2 * 4 + 10] = local_d8[local_c8 * 2 + 3];
                                pdVar3[uVar2 * 4 + 0xb] = local_d8[local_c8 + 3];
                                pdVar3[uVar2 * 4 + 0xd] = local_d8[local_c8 * 2 + 4];
                                pdVar3[uVar2 * 4 + 0xe] = local_d8[local_c8 + 4];
                                pdVar3[uVar2 * 4 + 0x10] = local_d8[local_c8 * 2 + 5];
                                pdVar3[uVar2 * 4 + 0x11] = local_d8[local_c8 + 5];
                                pdVar3[uVar2 * 4 + 0x13] = local_d8[local_c8 * 2 + 6];
                                pdVar3[uVar2 * 4 + 0x14] = local_d8[local_c8 + 6];
                                pdVar3[uVar2 * 4 + 0x16] = local_d8[local_c8 * 2 + 7];
                                pdVar3[uVar2 * 4 + 0x17] = local_d8[local_c8 + 7];
                                pdVar3[uVar2 * 4 + 0x19] = local_d8[local_c8 * 2 + 8];
                                pdVar3[uVar2 * 4 + 0x1a] = local_d8[local_c8 + 8];
                                pdVar3[uVar2 * 4 + 0x1c] = local_d8[local_c8 * 2 + 9];
                                pdVar3[uVar2 * 4 + 0x1d] = local_d8[local_c8 + 9];
                                pdVar3[uVar2 * 4 + 0x1f] = local_d8[local_c8 * 2 + 10];
                                if ((1 < (long)local_d0) &&
                                   ((lVar4 = (MatrB->
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                             ).m_storage.m_rows, 4 < lVar4 &&
                                    (uVar1 = (MatrB->
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                             ).m_storage.m_cols, 0x20 < (long)uVar1)))) {
                                  pdVar3 = (MatrB->
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                           ).m_storage.m_data;
                                  pdVar3[uVar1 * 4 + 0x20] = local_d8[local_c8 + 10];
                                  if ((((local_d0 != 2) &&
                                       (((0x22 < uVar1 &&
                                         (pdVar3[uVar1 * 4 + 0x22] = local_d8[local_c8 * 2 + 0xb],
                                         uVar1 != 0x23)) &&
                                        (pdVar3[uVar1 * 4 + 0x23] = local_d8[local_c8 + 0xb],
                                        0x25 < uVar1)))) &&
                                      (((pdVar3[uVar1 * 4 + 0x25] = local_d8[local_c8 * 2 + 0xc],
                                        uVar1 != 0x26 &&
                                        (pdVar3[uVar1 * 4 + 0x26] = local_d8[local_c8 + 0xc],
                                        0x28 < uVar1)) &&
                                       (pdVar3[uVar1 * 4 + 0x28] = local_d8[local_c8 * 2 + 0xd],
                                       uVar1 != 0x29)))) &&
                                     (((((pdVar3[uVar1 * 4 + 0x29] = local_d8[local_c8 + 0xd],
                                         0x2b < uVar1 &&
                                         (pdVar3[uVar1 * 4 + 0x2b] = local_d8[local_c8 * 2 + 0xe],
                                         uVar1 != 0x2c)) &&
                                        ((pdVar3[uVar1 * 4 + 0x2c] = local_d8[local_c8 + 0xe],
                                         0x2e < uVar1 &&
                                         ((((pdVar3[uVar1 * 4 + 0x2e] = local_d8[local_c8 * 2 + 0xf]
                                            , uVar1 != 0x2f &&
                                            (pdVar3[uVar1 * 4 + 0x2f] = local_d8[local_c8 + 0xf],
                                            0x31 < uVar1)) &&
                                           (pdVar3[uVar1 * 4 + 0x31] = local_d8[local_c8 * 2 + 0x10]
                                           , uVar1 != 0x32)) &&
                                          ((pdVar3[uVar1 * 4 + 0x32] = local_d8[local_c8 + 0x10],
                                           0x34 < uVar1 &&
                                           (pdVar3[uVar1 * 4 + 0x34] = local_d8[local_c8 * 2 + 0x11]
                                           , uVar1 != 0x35)))))))) &&
                                       (pdVar3[uVar1 * 4 + 0x35] = local_d8[local_c8 + 0x11],
                                       0x37 < uVar1)) &&
                                      (((pdVar3[uVar1 * 4 + 0x37] = local_d8[local_c8 * 2 + 0x12],
                                        uVar1 != 0x38 &&
                                        (pdVar3[uVar1 * 4 + 0x38] = local_d8[local_c8 + 0x12],
                                        0x3a < uVar1)) &&
                                       ((pdVar3[uVar1 * 4 + 0x3a] = local_d8[local_c8 * 2 + 0x13],
                                        uVar1 != 0x3b &&
                                        (pdVar3[uVar1 * 4 + 0x3b] = local_d8[local_c8 + 0x13],
                                        lVar4 != 5)))))))) {
                                    pdVar3[uVar1 * 5] = local_d8[local_c8 * 2];
                                    if ((0 < (long)local_c8) &&
                                       (pdVar3[uVar1 * 5 + 2] = *local_d8, local_c8 != 1)) {
                                      pdVar3[uVar1 * 5 + 3] = local_d8[local_c8 * 2 + 1];
                                      if ((1 < (long)local_c8) &&
                                         (pdVar3[uVar1 * 5 + 5] = local_d8[1], local_c8 != 2)) {
                                        pdVar3[uVar1 * 5 + 6] = local_d8[local_c8 * 2 + 2];
                                        if ((2 < (long)local_c8) &&
                                           (pdVar3[uVar1 * 5 + 8] = local_d8[2], local_c8 != 3)) {
                                          pdVar3[uVar1 * 5 + 9] = local_d8[local_c8 * 2 + 3];
                                          if ((3 < (long)local_c8) &&
                                             (pdVar3[uVar1 * 5 + 0xb] = local_d8[3], local_c8 != 4))
                                          {
                                            pdVar3[uVar1 * 5 + 0xc] = local_d8[local_c8 * 2 + 4];
                                            if ((4 < (long)local_c8) &&
                                               (pdVar3[uVar1 * 5 + 0xe] = local_d8[4], local_c8 != 5
                                               )) {
                                              pdVar3[uVar1 * 5 + 0xf] = local_d8[local_c8 * 2 + 5];
                                              if ((5 < (long)local_c8) &&
                                                 (pdVar3[uVar1 * 5 + 0x11] = local_d8[5],
                                                 local_c8 != 6)) {
                                                pdVar3[uVar1 * 5 + 0x12] =
                                                     local_d8[local_c8 * 2 + 6];
                                                if ((6 < (long)local_c8) &&
                                                   (pdVar3[uVar1 * 5 + 0x14] = local_d8[6],
                                                   local_c8 != 7)) {
                                                  pdVar3[uVar1 * 5 + 0x15] =
                                                       local_d8[local_c8 * 2 + 7];
                                                  if ((7 < (long)local_c8) &&
                                                     (pdVar3[uVar1 * 5 + 0x17] = local_d8[7],
                                                     local_c8 != 8)) {
                                                    pdVar3[uVar1 * 5 + 0x18] =
                                                         local_d8[local_c8 * 2 + 8];
                                                    if ((8 < (long)local_c8) &&
                                                       (pdVar3[uVar1 * 5 + 0x1a] = local_d8[8],
                                                       local_c8 != 9)) {
                                                      pdVar3[uVar1 * 5 + 0x1b] =
                                                           local_d8[local_c8 * 2 + 9];
                                                      if ((9 < (long)local_c8) &&
                                                         (pdVar3[uVar1 * 5 + 0x1d] = local_d8[9],
                                                         local_c8 != 10)) {
                                                        pdVar3[uVar1 * 5 + 0x1e] =
                                                             local_d8[local_c8 * 2 + 10];
                                                        if ((10 < (long)local_c8) &&
                                                           (pdVar3[uVar1 * 5 + 0x20] = local_d8[10],
                                                           local_c8 != 0xb)) {
                                                          pdVar3[uVar1 * 5 + 0x21] =
                                                               local_d8[local_c8 * 2 + 0xb];
                                                          if ((0xb < (long)local_c8) &&
                                                             (pdVar3[uVar1 * 5 + 0x23] =
                                                                   local_d8[0xb], local_c8 != 0xc))
                                                          {
                                                            pdVar3[uVar1 * 5 + 0x24] =
                                                                 local_d8[local_c8 * 2 + 0xc];
                                                            if ((0xc < (long)local_c8) &&
                                                               (pdVar3[uVar1 * 5 + 0x26] =
                                                                     local_d8[0xc], local_c8 != 0xd)
                                                               ) {
                                                              pdVar3[uVar1 * 5 + 0x27] =
                                                                   local_d8[local_c8 * 2 + 0xd];
                                                              if ((0xd < (long)local_c8) &&
                                                                 (pdVar3[uVar1 * 5 + 0x29] =
                                                                       local_d8[0xd],
                                                                 local_c8 != 0xe)) {
                                                                pdVar3[uVar1 * 5 + 0x2a] =
                                                                     local_d8[local_c8 * 2 + 0xe];
                                                                if ((0xe < (long)local_c8) &&
                                                                   (pdVar3[uVar1 * 5 + 0x2c] =
                                                                         local_d8[0xe],
                                                                   local_c8 != 0xf)) {
                                                                  pdVar3[uVar1 * 5 + 0x2d] =
                                                                       local_d8[local_c8 * 2 + 0xf];
                                                                  if ((0xf < (long)local_c8) &&
                                                                     (pdVar3[uVar1 * 5 + 0x2f] =
                                                                           local_d8[0xf],
                                                                     local_c8 != 0x10)) {
                                                                    pdVar3[uVar1 * 5 + 0x30] =
                                                                         local_d8[local_c8 * 2 +
                                                                                  0x10];
                                                                    if ((0x10 < (long)local_c8) &&
                                                                       (pdVar3[uVar1 * 5 + 0x32] =
                                                                             local_d8[0x10],
                                                                       local_c8 != 0x11)) {
                                                                      pdVar3[uVar1 * 5 + 0x33] =
                                                                           local_d8[local_c8 * 2 +
                                                                                    0x11];
                                                                      if (((0x11 < (long)local_c8)
                                                                          && (((pdVar3[uVar1 * 5 +
                                                                                       0x35] = 
                                                  local_d8[0x11], 2 < (long)local_d0 &&
                                                  (local_c8 != 0x12)) &&
                                                  (5 < (MatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows)))) &&
                                                  (uVar1 = (MatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols, 0x36 < (long)uVar1)) {
                                                    pdVar3 = (MatrB->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data;
                                                  pdVar3[uVar1 * 5 + 0x36] =
                                                       local_d8[local_c8 * 2 + 0x12];
                                                  if ((((0x12 < (long)local_c8) && (0x38 < uVar1))
                                                      && ((pdVar3[uVar1 * 5 + 0x38] = local_d8[0x12]
                                                          , local_c8 != 0x13 &&
                                                          ((uVar1 != 0x39 &&
                                                           (pdVar3[uVar1 * 5 + 0x39] =
                                                                 local_d8[local_c8 * 2 + 0x13],
                                                           0x13 < (long)local_c8)))))) &&
                                                     (0x3b < uVar1)) {
                                                    pdVar3[uVar1 * 5 + 0x3b] = local_d8[0x13];
                                                    free((void *)local_d8[-1]);
                                                    if (local_50[0] != 0) {
                                                      free(*(void **)(local_50[0] + -8));
                                                    }
                                                    if (local_98.m_data != (double *)0x0) {
                                                      free((void *)local_98.m_data[-1]);
                                                    }
                                                    if (local_b8.m_data != (double *)0x0) {
                                                      free((void *)local_b8.m_data[-1]);
                                                    }
                                                    return;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                 );
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
               );
}

Assistant:

void ChElementHexaCorot_20::ComputeMatrB(ChMatrixDynamic<>& MatrB,
                                         double zeta1,
                                         double zeta2,
                                         double zeta3,
                                         double& JacobianDet) {
    ChMatrixDynamic<> Jacobian(3, 3);
    ChMatrixDynamic<> J1(3, 20);
    ComputeJacobian(Jacobian, J1, ChVector<>(zeta1, zeta2, zeta3));

    // !!! store the Jacobian Determinant: needed for the integration
    JacobianDet = Jacobian.determinant();

    ChMatrixDynamic<> Jinv = Jacobian.inverse();
    ChMatrixDynamic<> Btemp = Jinv * J1;
    MatrB.setZero(6, 60);  // Remember to resize the matrix!

    MatrB(0, 0) = Btemp(0, 0);
    MatrB(0, 3) = Btemp(0, 1);
    MatrB(0, 6) = Btemp(0, 2);
    MatrB(0, 9) = Btemp(0, 3);
    MatrB(0, 12) = Btemp(0, 4);
    MatrB(0, 15) = Btemp(0, 5);
    MatrB(0, 18) = Btemp(0, 6);
    MatrB(0, 21) = Btemp(0, 7);
    MatrB(0, 24) = Btemp(0, 8);
    MatrB(0, 27) = Btemp(0, 9);
    MatrB(0, 30) = Btemp(0, 10);
    MatrB(0, 33) = Btemp(0, 11);
    MatrB(0, 36) = Btemp(0, 12);
    MatrB(0, 39) = Btemp(0, 13);
    MatrB(0, 42) = Btemp(0, 14);
    MatrB(0, 45) = Btemp(0, 15);
    MatrB(0, 48) = Btemp(0, 16);
    MatrB(0, 51) = Btemp(0, 17);
    MatrB(0, 54) = Btemp(0, 18);
    MatrB(0, 57) = Btemp(0, 19);

    MatrB(1, 1) = Btemp(1, 0);
    MatrB(1, 4) = Btemp(1, 1);
    MatrB(1, 7) = Btemp(1, 2);
    MatrB(1, 10) = Btemp(1, 3);
    MatrB(1, 13) = Btemp(1, 4);
    MatrB(1, 16) = Btemp(1, 5);
    MatrB(1, 19) = Btemp(1, 6);
    MatrB(1, 22) = Btemp(1, 7);
    MatrB(1, 25) = Btemp(1, 8);
    MatrB(1, 28) = Btemp(1, 9);
    MatrB(1, 31) = Btemp(1, 10);
    MatrB(1, 34) = Btemp(1, 11);
    MatrB(1, 37) = Btemp(1, 12);
    MatrB(1, 40) = Btemp(1, 13);
    MatrB(1, 43) = Btemp(1, 14);
    MatrB(1, 46) = Btemp(1, 15);
    MatrB(1, 49) = Btemp(1, 16);
    MatrB(1, 52) = Btemp(1, 17);
    MatrB(1, 55) = Btemp(1, 18);
    MatrB(1, 58) = Btemp(1, 19);

    MatrB(2, 2) = Btemp(2, 0);
    MatrB(2, 5) = Btemp(2, 1);
    MatrB(2, 8) = Btemp(2, 2);
    MatrB(2, 11) = Btemp(2, 3);
    MatrB(2, 14) = Btemp(2, 4);
    MatrB(2, 17) = Btemp(2, 5);
    MatrB(2, 20) = Btemp(2, 6);
    MatrB(2, 23) = Btemp(2, 7);
    MatrB(2, 26) = Btemp(2, 8);
    MatrB(2, 29) = Btemp(2, 9);
    MatrB(2, 32) = Btemp(2, 10);
    MatrB(2, 35) = Btemp(2, 11);
    MatrB(2, 38) = Btemp(2, 12);
    MatrB(2, 41) = Btemp(2, 13);
    MatrB(2, 44) = Btemp(2, 14);
    MatrB(2, 47) = Btemp(2, 15);
    MatrB(2, 50) = Btemp(2, 16);
    MatrB(2, 53) = Btemp(2, 17);
    MatrB(2, 56) = Btemp(2, 18);
    MatrB(2, 59) = Btemp(2, 19);

    MatrB(3, 0) = Btemp(1, 0);
    MatrB(3, 1) = Btemp(0, 0);
    MatrB(3, 3) = Btemp(1, 1);
    MatrB(3, 4) = Btemp(0, 1);
    MatrB(3, 6) = Btemp(1, 2);
    MatrB(3, 7) = Btemp(0, 2);
    MatrB(3, 9) = Btemp(1, 3);
    MatrB(3, 10) = Btemp(0, 3);
    MatrB(3, 12) = Btemp(1, 4);
    MatrB(3, 13) = Btemp(0, 4);
    MatrB(3, 15) = Btemp(1, 5);
    MatrB(3, 16) = Btemp(0, 5);
    MatrB(3, 18) = Btemp(1, 6);
    MatrB(3, 19) = Btemp(0, 6);
    MatrB(3, 21) = Btemp(1, 7);
    MatrB(3, 22) = Btemp(0, 7);
    MatrB(3, 24) = Btemp(1, 8);
    MatrB(3, 25) = Btemp(0, 8);
    MatrB(3, 27) = Btemp(1, 9);
    MatrB(3, 28) = Btemp(0, 9);
    MatrB(3, 30) = Btemp(1, 10);
    MatrB(3, 31) = Btemp(0, 10);
    MatrB(3, 33) = Btemp(1, 11);
    MatrB(3, 34) = Btemp(0, 11);
    MatrB(3, 36) = Btemp(1, 12);
    MatrB(3, 37) = Btemp(0, 12);
    MatrB(3, 39) = Btemp(1, 13);
    MatrB(3, 40) = Btemp(0, 13);
    MatrB(3, 42) = Btemp(1, 14);
    MatrB(3, 43) = Btemp(0, 14);
    MatrB(3, 45) = Btemp(1, 15);
    MatrB(3, 46) = Btemp(0, 15);
    MatrB(3, 48) = Btemp(1, 16);
    MatrB(3, 49) = Btemp(0, 16);
    MatrB(3, 51) = Btemp(1, 17);
    MatrB(3, 52) = Btemp(0, 17);
    MatrB(3, 54) = Btemp(1, 18);
    MatrB(3, 55) = Btemp(0, 18);
    MatrB(3, 57) = Btemp(1, 19);
    MatrB(3, 58) = Btemp(0, 19);

    MatrB(4, 1) = Btemp(2, 0);
    MatrB(4, 2) = Btemp(1, 0);
    MatrB(4, 4) = Btemp(2, 1);
    MatrB(4, 5) = Btemp(1, 1);
    MatrB(4, 7) = Btemp(2, 2);
    MatrB(4, 8) = Btemp(1, 2);
    MatrB(4, 10) = Btemp(2, 3);
    MatrB(4, 11) = Btemp(1, 3);
    MatrB(4, 13) = Btemp(2, 4);
    MatrB(4, 14) = Btemp(1, 4);
    MatrB(4, 16) = Btemp(2, 5);
    MatrB(4, 17) = Btemp(1, 5);
    MatrB(4, 19) = Btemp(2, 6);
    MatrB(4, 20) = Btemp(1, 6);
    MatrB(4, 22) = Btemp(2, 7);
    MatrB(4, 23) = Btemp(1, 7);
    MatrB(4, 25) = Btemp(2, 8);
    MatrB(4, 26) = Btemp(1, 8);
    MatrB(4, 28) = Btemp(2, 9);
    MatrB(4, 29) = Btemp(1, 9);
    MatrB(4, 31) = Btemp(2, 10);
    MatrB(4, 32) = Btemp(1, 10);
    MatrB(4, 34) = Btemp(2, 11);
    MatrB(4, 35) = Btemp(1, 11);
    MatrB(4, 37) = Btemp(2, 12);
    MatrB(4, 38) = Btemp(1, 12);
    MatrB(4, 40) = Btemp(2, 13);
    MatrB(4, 41) = Btemp(1, 13);
    MatrB(4, 43) = Btemp(2, 14);
    MatrB(4, 44) = Btemp(1, 14);
    MatrB(4, 46) = Btemp(2, 15);
    MatrB(4, 47) = Btemp(1, 15);
    MatrB(4, 49) = Btemp(2, 16);
    MatrB(4, 50) = Btemp(1, 16);
    MatrB(4, 52) = Btemp(2, 17);
    MatrB(4, 53) = Btemp(1, 17);
    MatrB(4, 55) = Btemp(2, 18);
    MatrB(4, 56) = Btemp(1, 18);
    MatrB(4, 58) = Btemp(2, 19);
    MatrB(4, 59) = Btemp(1, 19);

    MatrB(5, 0) = Btemp(2, 0);
    MatrB(5, 2) = Btemp(0, 0);
    MatrB(5, 3) = Btemp(2, 1);
    MatrB(5, 5) = Btemp(0, 1);
    MatrB(5, 6) = Btemp(2, 2);
    MatrB(5, 8) = Btemp(0, 2);
    MatrB(5, 9) = Btemp(2, 3);
    MatrB(5, 11) = Btemp(0, 3);
    MatrB(5, 12) = Btemp(2, 4);
    MatrB(5, 14) = Btemp(0, 4);
    MatrB(5, 15) = Btemp(2, 5);
    MatrB(5, 17) = Btemp(0, 5);
    MatrB(5, 18) = Btemp(2, 6);
    MatrB(5, 20) = Btemp(0, 6);
    MatrB(5, 21) = Btemp(2, 7);
    MatrB(5, 23) = Btemp(0, 7);
    MatrB(5, 24) = Btemp(2, 8);
    MatrB(5, 26) = Btemp(0, 8);
    MatrB(5, 27) = Btemp(2, 9);
    MatrB(5, 29) = Btemp(0, 9);
    MatrB(5, 30) = Btemp(2, 10);
    MatrB(5, 32) = Btemp(0, 10);
    MatrB(5, 33) = Btemp(2, 11);
    MatrB(5, 35) = Btemp(0, 11);
    MatrB(5, 36) = Btemp(2, 12);
    MatrB(5, 38) = Btemp(0, 12);
    MatrB(5, 39) = Btemp(2, 13);
    MatrB(5, 41) = Btemp(0, 13);
    MatrB(5, 42) = Btemp(2, 14);
    MatrB(5, 44) = Btemp(0, 14);
    MatrB(5, 45) = Btemp(2, 15);
    MatrB(5, 47) = Btemp(0, 15);
    MatrB(5, 48) = Btemp(2, 16);
    MatrB(5, 50) = Btemp(0, 16);
    MatrB(5, 51) = Btemp(2, 17);
    MatrB(5, 53) = Btemp(0, 17);
    MatrB(5, 54) = Btemp(2, 18);
    MatrB(5, 56) = Btemp(0, 18);
    MatrB(5, 57) = Btemp(2, 19);
    MatrB(5, 59) = Btemp(0, 19);
}